

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O0

shared_ptr<gui::Style> __thiscall
gui::DefaultTheme::loadStyle(DefaultTheme *this,String *widgetName)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  String *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  shared_ptr<gui::Style> sVar5;
  String *in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  DefaultTheme *in_stack_fffffffffffffc28;
  DefaultTheme *in_stack_fffffffffffffc38;
  locale *in_stack_fffffffffffffc40;
  locale *this_00;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  String *in_stack_fffffffffffffc50;
  DefaultTheme *in_stack_fffffffffffffc58;
  DefaultTheme *this_01;
  locale local_2b8 [56];
  locale local_280 [56];
  locale local_248 [56];
  undefined1 local_210 [112];
  locale local_1a0 [56];
  locale local_168 [56];
  locale local_130 [56];
  locale local_f8 [56];
  locale local_c0 [56];
  locale local_88 [72];
  locale local_40 [40];
  String *local_18;
  
  local_18 = in_RDX;
  std::locale::locale(local_40);
  sf::String::String(in_stack_fffffffffffffc50,
                     (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                     in_stack_fffffffffffffc40);
  bVar1 = sf::operator==((String *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                         in_stack_fffffffffffffbf8);
  sf::String::~String((String *)0x168e60);
  std::locale::~locale(local_40);
  if (bVar1) {
    makeButtonStyle((DefaultTheme *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    std::shared_ptr<gui::Style>::shared_ptr<gui::ButtonStyle,void>
              ((shared_ptr<gui::Style> *)
               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
               (shared_ptr<gui::ButtonStyle> *)in_stack_fffffffffffffbf8);
    std::shared_ptr<gui::ButtonStyle>::~shared_ptr((shared_ptr<gui::ButtonStyle> *)0x168eb4);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    std::locale::locale(local_88);
    sf::String::String(in_stack_fffffffffffffc50,
                       (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                       in_stack_fffffffffffffc40);
    bVar1 = sf::operator==((String *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                           in_stack_fffffffffffffbf8);
    sf::String::~String((String *)0x168f70);
    std::locale::~locale(local_88);
    if (bVar1) {
      makeChatBoxStyle((DefaultTheme *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48)
                      );
      std::shared_ptr<gui::Style>::shared_ptr<gui::ChatBoxStyle,void>
                ((shared_ptr<gui::Style> *)
                 CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                 (shared_ptr<gui::ChatBoxStyle> *)in_stack_fffffffffffffbf8);
      std::shared_ptr<gui::ChatBoxStyle>::~shared_ptr((shared_ptr<gui::ChatBoxStyle> *)0x168fc4);
      _Var4._M_pi = extraout_RDX_00;
    }
    else {
      std::locale::locale(local_c0);
      sf::String::String(in_stack_fffffffffffffc50,
                         (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                         in_stack_fffffffffffffc40);
      bVar1 = sf::operator==((String *)CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00)
                             ,in_stack_fffffffffffffbf8);
      sf::String::~String((String *)0x169080);
      std::locale::~locale(local_c0);
      if (bVar1) {
        makeCheckBoxStyle((DefaultTheme *)
                          CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
        std::shared_ptr<gui::Style>::shared_ptr<gui::CheckBoxStyle,void>
                  ((shared_ptr<gui::Style> *)
                   CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                   (shared_ptr<gui::CheckBoxStyle> *)in_stack_fffffffffffffbf8);
        std::shared_ptr<gui::CheckBoxStyle>::~shared_ptr((shared_ptr<gui::CheckBoxStyle> *)0x1690d4)
        ;
        _Var4._M_pi = extraout_RDX_01;
      }
      else {
        std::locale::locale(local_f8);
        sf::String::String(in_stack_fffffffffffffc50,
                           (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                           in_stack_fffffffffffffc40);
        bVar1 = sf::operator==((String *)
                               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                               in_stack_fffffffffffffbf8);
        sf::String::~String((String *)0x169190);
        std::locale::~locale(local_f8);
        if (bVar1) {
          makeColorPickerStyle(in_stack_fffffffffffffc28);
          std::shared_ptr<gui::Style>::shared_ptr<gui::ColorPickerStyle,void>
                    ((shared_ptr<gui::Style> *)
                     CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                     (shared_ptr<gui::ColorPickerStyle> *)in_stack_fffffffffffffbf8);
          std::shared_ptr<gui::ColorPickerStyle>::~shared_ptr
                    ((shared_ptr<gui::ColorPickerStyle> *)0x1691e4);
          _Var4._M_pi = extraout_RDX_02;
        }
        else {
          std::locale::locale(local_130);
          sf::String::String(in_stack_fffffffffffffc50,
                             (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48),
                             in_stack_fffffffffffffc40);
          bVar1 = sf::operator==((String *)
                                 CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                                 in_stack_fffffffffffffbf8);
          sf::String::~String((String *)0x1692a0);
          std::locale::~locale(local_130);
          if (bVar1) {
            makeDialogBoxStyle(in_stack_fffffffffffffc38);
            std::shared_ptr<gui::Style>::shared_ptr<gui::DialogBoxStyle,void>
                      ((shared_ptr<gui::Style> *)
                       CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                       (shared_ptr<gui::DialogBoxStyle> *)in_stack_fffffffffffffbf8);
            std::shared_ptr<gui::DialogBoxStyle>::~shared_ptr
                      ((shared_ptr<gui::DialogBoxStyle> *)0x1692f4);
            _Var4._M_pi = extraout_RDX_03;
          }
          else {
            std::locale::locale(local_168);
            sf::String::String(in_stack_fffffffffffffc50,
                               (char *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48)
                               ,in_stack_fffffffffffffc40);
            bVar1 = sf::operator==((String *)
                                   CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                                   in_stack_fffffffffffffbf8);
            sf::String::~String((String *)0x1693b0);
            std::locale::~locale(local_168);
            if (bVar1) {
              makeLabelStyle((DefaultTheme *)
                             CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
              std::shared_ptr<gui::Style>::shared_ptr<gui::LabelStyle,void>
                        ((shared_ptr<gui::Style> *)
                         CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                         (shared_ptr<gui::LabelStyle> *)in_stack_fffffffffffffbf8);
              std::shared_ptr<gui::LabelStyle>::~shared_ptr((shared_ptr<gui::LabelStyle> *)0x169404)
              ;
              _Var4._M_pi = extraout_RDX_04;
            }
            else {
              std::locale::locale(local_1a0);
              sf::String::String(in_stack_fffffffffffffc50,
                                 (char *)CONCAT17(in_stack_fffffffffffffc4f,
                                                  in_stack_fffffffffffffc48),
                                 in_stack_fffffffffffffc40);
              bVar1 = sf::operator==((String *)
                                     CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                                     in_stack_fffffffffffffbf8);
              sf::String::~String((String *)0x1694c0);
              std::locale::~locale(local_1a0);
              if (bVar1) {
                makeMenuBarStyle(in_stack_fffffffffffffc58);
                std::shared_ptr<gui::Style>::shared_ptr<gui::MenuBarStyle,void>
                          ((shared_ptr<gui::Style> *)
                           CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                           (shared_ptr<gui::MenuBarStyle> *)in_stack_fffffffffffffbf8);
                std::shared_ptr<gui::MenuBarStyle>::~shared_ptr
                          ((shared_ptr<gui::MenuBarStyle> *)0x169514);
                _Var4._M_pi = extraout_RDX_05;
              }
              else {
                std::locale::locale((locale *)(local_210 + 0x38));
                sf::String::String(in_stack_fffffffffffffc50,
                                   (char *)CONCAT17(in_stack_fffffffffffffc4f,
                                                    in_stack_fffffffffffffc48),
                                   in_stack_fffffffffffffc40);
                bVar1 = sf::operator==((String *)
                                       CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00)
                                       ,in_stack_fffffffffffffbf8);
                sf::String::~String((String *)0x1695c1);
                std::locale::~locale((locale *)(local_210 + 0x38));
                if (bVar1) {
                  makeMultilineTextBoxStyle(in_stack_fffffffffffffc58);
                  std::shared_ptr<gui::Style>::shared_ptr<gui::MultilineTextBoxStyle,void>
                            ((shared_ptr<gui::Style> *)
                             CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                             (shared_ptr<gui::MultilineTextBoxStyle> *)in_stack_fffffffffffffbf8);
                  std::shared_ptr<gui::MultilineTextBoxStyle>::~shared_ptr
                            ((shared_ptr<gui::MultilineTextBoxStyle> *)0x169612);
                  _Var4._M_pi = extraout_RDX_06;
                }
                else {
                  this_01 = (DefaultTheme *)local_210;
                  std::locale::locale((locale *)this_01);
                  sf::String::String(local_18,(char *)CONCAT17(in_stack_fffffffffffffc4f,
                                                               in_stack_fffffffffffffc48),
                                     in_stack_fffffffffffffc40);
                  bVar2 = sf::operator==((String *)
                                         CONCAT17(in_stack_fffffffffffffc07,
                                                  in_stack_fffffffffffffc00),
                                         in_stack_fffffffffffffbf8);
                  sf::String::~String((String *)0x1696bf);
                  std::locale::~locale((locale *)local_210);
                  if ((bVar2 & 1) == 0) {
                    this_00 = local_248;
                    std::locale::locale(this_00);
                    sf::String::String(local_18,(char *)CONCAT17(bVar2,in_stack_fffffffffffffc48),
                                       this_00);
                    bVar1 = sf::operator==((String *)
                                           CONCAT17(in_stack_fffffffffffffc07,
                                                    in_stack_fffffffffffffc00),
                                           in_stack_fffffffffffffbf8);
                    sf::String::~String((String *)0x1697bd);
                    std::locale::~locale(local_248);
                    if (bVar1) {
                      makeRadioButtonStyle
                                ((DefaultTheme *)CONCAT17(bVar2,in_stack_fffffffffffffc48));
                      std::shared_ptr<gui::Style>::shared_ptr<gui::RadioButtonStyle,void>
                                ((shared_ptr<gui::Style> *)
                                 CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                                 (shared_ptr<gui::RadioButtonStyle> *)in_stack_fffffffffffffbf8);
                      std::shared_ptr<gui::RadioButtonStyle>::~shared_ptr
                                ((shared_ptr<gui::RadioButtonStyle> *)0x16980e);
                      _Var4._M_pi = extraout_RDX_08;
                    }
                    else {
                      std::locale::locale(local_280);
                      sf::String::String(local_18,(char *)CONCAT17(bVar2,in_stack_fffffffffffffc48),
                                         this_00);
                      bVar3 = sf::operator==((String *)
                                             CONCAT17(in_stack_fffffffffffffc07,
                                                      in_stack_fffffffffffffc00),
                                             in_stack_fffffffffffffbf8);
                      sf::String::~String((String *)0x1698bb);
                      std::locale::~locale(local_280);
                      if ((bVar3 & 1) == 0) {
                        std::locale::locale(local_2b8);
                        sf::String::String(local_18,(char *)CONCAT17(bVar2,in_stack_fffffffffffffc48
                                                                    ),this_00);
                        bVar2 = sf::operator==((String *)
                                               CONCAT17(in_stack_fffffffffffffc07,
                                                        in_stack_fffffffffffffc00),
                                               in_stack_fffffffffffffbf8);
                        sf::String::~String((String *)0x1699b9);
                        std::locale::~locale(local_2b8);
                        if ((bVar2 & 1) == 0) {
                          std::shared_ptr<gui::Style>::shared_ptr
                                    ((shared_ptr<gui::Style> *)
                                     CONCAT17(bVar2,in_stack_fffffffffffffc00),
                                     in_stack_fffffffffffffbf8);
                          _Var4._M_pi = extraout_RDX_11;
                        }
                        else {
                          makeTextBoxStyle(this_01);
                          std::shared_ptr<gui::Style>::shared_ptr<gui::TextBoxStyle,void>
                                    ((shared_ptr<gui::Style> *)
                                     CONCAT17(bVar2,in_stack_fffffffffffffc00),
                                     (shared_ptr<gui::TextBoxStyle> *)in_stack_fffffffffffffbf8);
                          std::shared_ptr<gui::TextBoxStyle>::~shared_ptr
                                    ((shared_ptr<gui::TextBoxStyle> *)0x169a07);
                          _Var4._M_pi = extraout_RDX_10;
                        }
                      }
                      else {
                        makeSliderStyle((DefaultTheme *)CONCAT17(bVar3,in_stack_fffffffffffffc18));
                        std::shared_ptr<gui::Style>::shared_ptr<gui::SliderStyle,void>
                                  ((shared_ptr<gui::Style> *)
                                   CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                                   (shared_ptr<gui::SliderStyle> *)in_stack_fffffffffffffbf8);
                        std::shared_ptr<gui::SliderStyle>::~shared_ptr
                                  ((shared_ptr<gui::SliderStyle> *)0x16990c);
                        _Var4._M_pi = extraout_RDX_09;
                      }
                    }
                  }
                  else {
                    makePanelStyle((DefaultTheme *)
                                   CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
                    std::shared_ptr<gui::Style>::shared_ptr<gui::PanelStyle,void>
                              ((shared_ptr<gui::Style> *)
                               CONCAT17(in_stack_fffffffffffffc07,in_stack_fffffffffffffc00),
                               (shared_ptr<gui::PanelStyle> *)in_stack_fffffffffffffbf8);
                    std::shared_ptr<gui::PanelStyle>::~shared_ptr
                              ((shared_ptr<gui::PanelStyle> *)0x169710);
                    _Var4._M_pi = extraout_RDX_07;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  sVar5.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<gui::Style>)sVar5.super___shared_ptr<gui::Style,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Style> DefaultTheme::loadStyle(const sf::String& widgetName) const {
    GUI_DEBUG << "Loading style for \"" << widgetName.toAnsiString() << "\".\n";
    if (widgetName == "Button") {
        return makeButtonStyle();
    } else if (widgetName == "ChatBox") {
        return makeChatBoxStyle();
    } else if (widgetName == "CheckBox") {
        return makeCheckBoxStyle();
    } else if (widgetName == "ColorPicker") {
        return makeColorPickerStyle();
    } else if (widgetName == "DialogBox") {
        return makeDialogBoxStyle();
    } else if (widgetName == "Label") {
        return makeLabelStyle();
    } else if (widgetName == "MenuBar") {
        return makeMenuBarStyle();
    } else if (widgetName == "MultilineTextBox") {
        return makeMultilineTextBoxStyle();
    } else if (widgetName == "Panel") {
        return makePanelStyle();
    } else if (widgetName == "RadioButton") {
        return makeRadioButtonStyle();
    } else if (widgetName == "Slider") {
        return makeSliderStyle();
    } else if (widgetName == "TextBox") {
        return makeTextBoxStyle();
    }

    // Normally if we don't find the widget, then fall back to the base class
    // version. In this case the base class doesn't implement it though.
    //return Theme::loadStyle(widgetName);
    return nullptr;
}